

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport-sysfs-gpio.c
# Opt level: O0

void handle_outbound(aura_node *node,aura_object *o,aura_buffer *buf)

{
  int iVar1;
  uint32_t local_3c;
  uint32_t local_38;
  int gpio_4;
  int gpio_3;
  int gpio_2;
  int value;
  int gpio_1;
  int gpio;
  int ret;
  aura_buffer *buf_local;
  aura_object *o_local;
  aura_node *node_local;
  
  gpio_1 = -5;
  _gpio = buf;
  buf_local = (aura_buffer *)o;
  o_local = (aura_object *)node;
  iVar1 = strcmp(o->name,"export");
  if (iVar1 == 0) {
    value = aura_buffer_get_u32(_gpio);
    slog(4,4,"gpio: export %d",(ulong)(uint)value);
    gpio_1 = gpio_export(value);
  }
  else {
    iVar1 = strcmp(*(char **)&buf_local->pos,"write");
    if (iVar1 == 0) {
      gpio_2 = aura_buffer_get_u32(_gpio);
      gpio_3 = aura_buffer_get_u32(_gpio);
      slog(4,4,"gpio: write gpio %d value %d",(ulong)(uint)gpio_2,(ulong)(uint)gpio_3);
      gpio_1 = gpio_write(gpio_2,gpio_3);
    }
    else {
      iVar1 = strcmp(*(char **)&buf_local->pos,"in");
      if (iVar1 == 0) {
        gpio_4 = aura_buffer_get_u32(_gpio);
        gpio_1 = gpio_in(gpio_4);
      }
      else {
        iVar1 = strcmp(*(char **)&buf_local->pos,"out");
        if (iVar1 == 0) {
          local_38 = aura_buffer_get_u32(_gpio);
          gpio_1 = gpio_out(local_38);
        }
        else {
          iVar1 = strcmp(*(char **)&buf_local->pos,"read");
          if (iVar1 == 0) {
            local_3c = aura_buffer_get_u32(_gpio);
            gpio_1 = gpio_read(local_3c,(int *)&local_3c);
            aura_buffer_rewind(_gpio);
            aura_buffer_put_u32(_gpio,local_3c);
          }
        }
      }
    }
  }
  slog(0,4,"gpio ret = %d",(ulong)(uint)gpio_1);
  if (gpio_1 == 0) {
    aura_queue_buffer((list_head *)&o_local->arglen,_gpio);
  }
  else {
    aura_call_fail((aura_node *)o_local,(aura_object *)buf_local);
  }
  return;
}

Assistant:

static void handle_outbound(struct aura_node *node, struct aura_object *o, struct aura_buffer *buf)
{
	int ret = -EIO;

	if (OPCODE("export")) {
		int gpio = aura_buffer_get_u32(buf);
		slog(4, SLOG_DEBUG, "gpio: export %d", gpio);
		ret = gpio_export(gpio);
	} else if (OPCODE("write")) {
		int gpio = aura_buffer_get_u32(buf);
		int value = aura_buffer_get_u32(buf);
		slog(4, SLOG_DEBUG, "gpio: write gpio %d value %d", gpio, value);
		ret = gpio_write(gpio, value);
	} else if (OPCODE("in")) {
		int gpio = aura_buffer_get_u32(buf);
		ret = gpio_in(gpio);
	} else if (OPCODE("out")) {
		int gpio = aura_buffer_get_u32(buf);
		ret = gpio_out(gpio);
	} else if (OPCODE("read")) {
		int gpio = aura_buffer_get_u32(buf);
		ret = gpio_read(gpio, &gpio);
		aura_buffer_rewind(buf);
		aura_buffer_put_u32(buf, gpio);
	}
	slog(0, SLOG_DEBUG, "gpio ret = %d", ret);
	if (ret) {
		aura_call_fail(node, o);
		return;
	}
	aura_queue_buffer(&node->inbound_buffers, buf);
}